

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O0

void __thiscall
QPlainTestLogger::printBenchmarkResults(QPlainTestLogger *this,QList<QBenchmarkResult> *results)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  bool bVar4;
  double *pdVar5;
  QBenchmarkResult *pQVar6;
  FixedBufString<1022> *in_RDI;
  long in_FS_OFFSET;
  optional<double> oVar7;
  qreal valuePerIteration;
  int significantDigits;
  char *unitText;
  QBenchmarkResult *result;
  QList<QBenchmarkResult> *__range1;
  qreal executionTime;
  const_iterator __end1;
  const_iterator __begin1;
  anon_class_8_1_c4c56ed6 findResultFor;
  optional<double> cycles;
  optional<double> ms;
  optional<double> ns;
  FixedBufString<1022> buf;
  undefined4 in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  QList<QBenchmarkResult> *in_stack_fffffffffffffaf0;
  char *in_stack_fffffffffffffaf8;
  FixedBufString<1022> *in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  QBenchmarkMetric QVar8;
  char *format;
  anon_class_8_1_c4c56ed6 *in_stack_fffffffffffffb10;
  FixedBufString<1022> *this_00;
  qreal in_stack_fffffffffffffb20;
  double local_4a8;
  Data *in_stack_fffffffffffffb70;
  char local_478 [24];
  QBenchmarkResult *local_460;
  const_iterator local_458;
  const_iterator local_450 [2];
  _Storage<double,_true> local_440;
  bool local_438;
  int iVar9;
  FixedBufString<1022> local_410;
  long local_8;
  
  QVar8 = (QBenchmarkMetric)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_410,0xaa,0x408);
  anon_unknown.dwarf_9d58f::FixedBufString<1022>::FixedBufString((FixedBufString<1022> *)0x12fd9a);
  local_4a8 = 0.0;
  printBenchmarkResults::anon_class_8_1_c4c56ed6::operator()(in_stack_fffffffffffffb10,QVar8);
  bVar4 = std::optional::operator_cast_to_bool((optional<double> *)0x12fe0c);
  if (bVar4) {
    pdVar5 = std::optional<double>::operator*((optional<double> *)0x12fe1f);
    local_4a8 = *pdVar5 / 1000000000.0;
  }
  else {
    printBenchmarkResults::anon_class_8_1_c4c56ed6::operator()(in_stack_fffffffffffffb10,QVar8);
    bVar4 = std::optional::operator_cast_to_bool((optional<double> *)0x12fe84);
    if (bVar4) {
      pdVar5 = std::optional<double>::operator*((optional<double> *)0x12fe97);
      local_4a8 = *pdVar5 / 1000.0;
    }
  }
  local_450[0].i = (QBenchmarkResult *)&DAT_aaaaaaaaaaaaaaaa;
  local_450[0] = QList<QBenchmarkResult>::begin(in_stack_fffffffffffffaf0);
  local_458.i = (QBenchmarkResult *)&DAT_aaaaaaaaaaaaaaaa;
  local_458 = QList<QBenchmarkResult>::end(in_stack_fffffffffffffaf0);
  do {
    local_460 = local_458.i;
    bVar4 = QList<QBenchmarkResult>::const_iterator::operator!=(local_450,local_458);
    if (!bVar4) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    pQVar6 = QList<QBenchmarkResult>::const_iterator::operator*(local_450);
    this_00 = &local_410;
    anon_unknown.dwarf_9d58f::FixedBufString<1022>::clear((FixedBufString<1022> *)0x12ff6b);
    QTest::benchmarkMetricUnit((pQVar6->measurement).metric);
    QTest::countSignificantDigits<double>((pQVar6->measurement).value);
    uVar2 = _local_438;
    format = local_478;
    iVar9 = (int)((ulong)_local_438 >> 0x20);
    iVar3 = iVar9;
    _local_438 = (undefined1 *)uVar2;
    QTest::formatResult<double>((double)in_stack_fffffffffffffb70,iVar3);
    QByteArray::constData((QByteArray *)0x12ffcf);
    (anonymous_namespace)::FixedBufString<1022>::appendf<char_const*,char_const*,char_const*>
              (this_00,format,(char *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
               (char *)in_stack_fffffffffffffaf0);
    QVar8 = (QBenchmarkMetric)((ulong)format >> 0x20);
    QByteArray::~QByteArray((QByteArray *)0x130016);
    in_stack_fffffffffffffb00 = (FixedBufString<1022> *)(ulong)(pQVar6->measurement).metric;
    switch(in_stack_fffffffffffffb00) {
    case (FixedBufString<1022> *)0x0:
    case (FixedBufString<1022> *)0x3:
    case (FixedBufString<1022> *)0x4:
    case (FixedBufString<1022> *)0x7:
      break;
    case (FixedBufString<1022> *)0x1:
      anon_unknown.dwarf_9d58f::FixedBufString<1022>::appendScaled<1000>
                (in_RDI,in_stack_fffffffffffffb20,(char *)this_00);
      break;
    case (FixedBufString<1022> *)0x2:
      anon_unknown.dwarf_9d58f::FixedBufString<1022>::appendScaled<1024>
                (in_RDI,in_stack_fffffffffffffb20,(char *)this_00);
      break;
    case (FixedBufString<1022> *)0x5:
    case (FixedBufString<1022> *)0x6:
    case (FixedBufString<1022> *)0x8:
    case (FixedBufString<1022> *)0x9:
    case (FixedBufString<1022> *)0xb:
    case (FixedBufString<1022> *)0xc:
    case (FixedBufString<1022> *)0xe:
    case (FixedBufString<1022> *)0xf:
    case (FixedBufString<1022> *)0x10:
    case (FixedBufString<1022> *)0x11:
    case (FixedBufString<1022> *)0x12:
    case (FixedBufString<1022> *)0x13:
    case (FixedBufString<1022> *)0x14:
    case (FixedBufString<1022> *)0x15:
    case (FixedBufString<1022> *)0x16:
    case (FixedBufString<1022> *)0x17:
    case (FixedBufString<1022> *)0x18:
    case (FixedBufString<1022> *)0x19:
    case (FixedBufString<1022> *)0x1a:
    case (FixedBufString<1022> *)0x1b:
    case (FixedBufString<1022> *)0x1c:
    case (FixedBufString<1022> *)0x1d:
switchD_00130040_caseD_5:
      bVar4 = qIsNull(local_4a8);
      if (!bVar4) {
        anon_unknown.dwarf_9d58f::FixedBufString<1022>::appendScaled<1000>
                  (in_RDI,in_stack_fffffffffffffb20,(char *)this_00);
      }
      break;
    case (FixedBufString<1022> *)0xa:
    case (FixedBufString<1022> *)0x1e:
      bVar4 = qIsNull(local_4a8);
      if (!bVar4) {
        anon_unknown.dwarf_9d58f::FixedBufString<1022>::appendScaled<1000>
                  (in_RDI,in_stack_fffffffffffffb20,(char *)this_00);
      }
      break;
    case (FixedBufString<1022> *)0xd:
      local_440 = (_Storage<double,_true>)0xffffffffffffffff;
      _local_438 = &DAT_aaaaaaaaaaaaaaaa;
      oVar7 = printBenchmarkResults::anon_class_8_1_c4c56ed6::operator()
                        ((anon_class_8_1_c4c56ed6 *)this_00,QVar8);
      local_440 = oVar7.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
      uVar1 = (ulong)_local_438 >> 8;
      _local_438 = (undefined1 *)
                   CONCAT71((int7)uVar1,
                            oVar7.super__Optional_base<double,_true,_true>._M_payload.
                            super__Optional_payload_base<double>._M_engaged);
      bVar4 = std::optional::operator_cast_to_bool((optional<double> *)0x130132);
      if (!bVar4) goto switchD_00130040_caseD_5;
      in_stack_fffffffffffffaf8 = (char *)(pQVar6->measurement).value;
      std::optional<double>::operator*((optional<double> *)0x130155);
      anon_unknown.dwarf_9d58f::FixedBufString<1022>::appendf<double>
                (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                 (double)in_stack_fffffffffffffaf0);
    }
    uVar2 = _local_438;
    in_stack_fffffffffffffaf0 = (QList<QBenchmarkResult> *)&stack0xfffffffffffffb70;
    iVar9 = (int)((ulong)_local_438 >> 0x20);
    iVar3 = iVar9;
    _local_438 = (undefined1 *)uVar2;
    QTest::formatResult<double>((double)in_stack_fffffffffffffb70,iVar3);
    QByteArray::constData((QByteArray *)0x1301d8);
    (anonymous_namespace)::FixedBufString<1022>::appendf<char_const*,int>
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(char *)in_stack_fffffffffffffaf0
               ,in_stack_fffffffffffffaec);
    QByteArray::~QByteArray((QByteArray *)0x130206);
    (anonymous_namespace)::FixedBufString::operator_cast_to_char_((FixedBufString<1022> *)0x130213);
    outputMessage((QPlainTestLogger *)in_stack_fffffffffffffaf0,
                  (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    QList<QBenchmarkResult>::const_iterator::operator++(local_450);
  } while( true );
}

Assistant:

void QPlainTestLogger::printBenchmarkResults(const QList<QBenchmarkResult> &results)
{
    using namespace std::chrono;
    FixedBufString<1022> buf;
    auto findResultFor = [&results](QTest::QBenchmarkMetric metric) -> std::optional<qreal> {
        for (const QBenchmarkResult &result : results) {
            if (result.measurement.metric == metric)
                return result.measurement.value;
        }
        return std::nullopt;
    };

    // we need the execution time quite often, so find it first
    qreal executionTime = 0;
    if (auto ns = findResultFor(QTest::WalltimeNanoseconds))
        executionTime = *ns / (1000 * 1000 * 1000);
    else if (auto ms = findResultFor(QTest::WalltimeMilliseconds))
        executionTime = *ms / 1000;

    for (const QBenchmarkResult &result : results) {
        buf.clear();

        const char * unitText = QTest::benchmarkMetricUnit(result.measurement.metric);
        int significantDigits = QTest::countSignificantDigits(result.measurement.value);
        qreal valuePerIteration = qreal(result.measurement.value) / qreal(result.iterations);
        buf.appendf("     %s %s%s", QTest::formatResult(valuePerIteration, significantDigits).constData(),
                    unitText, result.setByMacro ? " per iteration" : "");

        switch (result.measurement.metric) {
        case QTest::BitsPerSecond:
            // for bits/s, we'll use powers of 10 (1 Mbit/s = 1000 kbit/s = 1000000 bit/s)
            buf.appendScaled<1000>(result.measurement.value, "bit/s");
            break;
        case QTest::BytesPerSecond:
            // for B/s, we'll use powers of 2 (1 MB/s = 1024 kB/s = 1048576 B/s)
            buf.appendScaled<1024>(result.measurement.value, "B/s");
            break;

        case QTest::CPUCycles:
        case QTest::RefCPUCycles:
            if (!qIsNull(executionTime))
                buf.appendScaled(result.measurement.value / executionTime, "Hz");
            break;

        case QTest::Instructions:
            if (auto cycles = findResultFor(QTest::CPUCycles)) {
                buf.appendf(", %.3f instr/cycle", result.measurement.value / *cycles);
                break;
            }
            Q_FALLTHROUGH();

        case QTest::InstructionReads:
        case QTest::Events:
        case QTest::BytesAllocated:
        case QTest::CPUMigrations:
        case QTest::BusCycles:
        case QTest::StalledCycles:
        case QTest::BranchInstructions:
        case QTest::BranchMisses:
        case QTest::CacheReferences:
        case QTest::CacheReads:
        case QTest::CacheWrites:
        case QTest::CachePrefetches:
        case QTest::CacheMisses:
        case QTest::CacheReadMisses:
        case QTest::CacheWriteMisses:
        case QTest::CachePrefetchMisses:
        case QTest::ContextSwitches:
        case QTest::PageFaults:
        case QTest::MinorPageFaults:
        case QTest::MajorPageFaults:
        case QTest::AlignmentFaults:
        case QTest::EmulationFaults:
            if (!qIsNull(executionTime))
                buf.appendScaled(result.measurement.value / executionTime, "/sec");
            break;

        case QTest::FramesPerSecond:
        case QTest::CPUTicks:
        case QTest::WalltimeMilliseconds:
        case QTest::WalltimeNanoseconds:
            break;  // no additional information
        }

        Q_ASSERT(result.iterations > 0);
        buf.appendf(" (total: %s, iterations: %d)\n",
                    QTest::formatResult(result.measurement.value, significantDigits).constData(),
                    result.iterations);

        outputMessage(buf);
    }
}